

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_encoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveEncoder::Done
          (MeshEdgebreakerTraversalPredictiveEncoder *this)

{
  size_type sVar1;
  MeshEdgebreakerTraversalEncoder *in_RDI;
  reference rVar2;
  int i;
  RAnsBitEncoder *in_stack_00000040;
  BinaryEncoder prediction_encoder;
  undefined8 in_stack_ffffffffffffff78;
  MeshEdgebreakerTraversalEncoder *in_stack_ffffffffffffff80;
  RAnsBitEncoder *this_00;
  _Bit_type *in_stack_ffffffffffffffa0;
  EncoderBuffer *in_stack_ffffffffffffffa8;
  int local_50;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffc0;
  
  if (*(int *)&in_RDI[1].traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
               _M_impl.field_0x10 != -1) {
    MeshEdgebreakerTraversalEncoder::EncodeSymbol
              (in_stack_ffffffffffffff80,
               (EdgebreakerTopologyBitPattern)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  MeshEdgebreakerTraversalEncoder::Done(in_stack_ffffffffffffff80);
  MeshEdgebreakerTraversalEncoder::GetOutputBuffer(in_RDI);
  EncoderBuffer::Encode<int>(in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
  RAnsBitEncoder::RAnsBitEncoder(&in_stack_ffffffffffffff80->start_face_encoder_);
  RAnsBitEncoder::StartEncoding((RAnsBitEncoder *)0x19d516);
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffc0);
  rVar2._M_mask = (_Bit_type)in_stack_ffffffffffffff80;
  rVar2._M_p = in_stack_ffffffffffffffa0;
  local_50 = (int)sVar1;
  while (local_50 = local_50 + -1, -1 < local_50) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar2._M_p,(size_type)in_RDI);
    std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffa0);
    RAnsBitEncoder::EncodeBit
              ((RAnsBitEncoder *)rVar2._M_mask,SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  }
  MeshEdgebreakerTraversalEncoder::GetOutputBuffer(in_RDI);
  this_00 = (RAnsBitEncoder *)rVar2._M_mask;
  RAnsBitEncoder::EndEncoding(in_stack_00000040,_i);
  RAnsBitEncoder::~RAnsBitEncoder(this_00);
  return;
}

Assistant:

void Done() {
    // We still need to store the last encoded symbol.
    if (prev_symbol_ != -1) {
      MeshEdgebreakerTraversalEncoder::EncodeSymbol(
          static_cast<EdgebreakerTopologyBitPattern>(prev_symbol_));
    }
    // Store the init face configurations and the explicitly encoded symbols.
    MeshEdgebreakerTraversalEncoder::Done();
    // Encode the number of split symbols.
    GetOutputBuffer()->Encode(num_split_symbols_);
    // Store the predictions.
    BinaryEncoder prediction_encoder;
    prediction_encoder.StartEncoding();
    for (int i = static_cast<int>(predictions_.size()) - 1; i >= 0; --i) {
      prediction_encoder.EncodeBit(predictions_[i]);
    }
    prediction_encoder.EndEncoding(GetOutputBuffer());
  }